

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O0

void TMS320C64x_post_printer(csh ud,cs_insn *insn,char *insn_asm,MCInst *mci)

{
  long lVar1;
  char *pcVar2;
  long in_RCX;
  char *in_RDX;
  long in_RSI;
  cs_tms320c64x *tms320c64x;
  int i;
  uint unit;
  char tmp [8];
  char *p2;
  char *p;
  SStream ss;
  char *in_stack_fffffffffffffd98;
  undefined2 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda2;
  undefined1 in_stack_fffffffffffffda3;
  uint in_stack_fffffffffffffda4;
  ulong in_stack_fffffffffffffda8;
  int local_248;
  int local_244;
  char local_240 [8];
  char *local_238;
  char *local_230;
  char local_224 [140];
  
  local_244 = 0;
  if (*(int *)(*(long *)(in_RCX + 800) + 0x60) != 0) {
    lVar1 = *(long *)(*(long *)(in_RCX + 0x310) + 0xf0);
    for (local_248 = 0; local_248 < (int)(uint)*(byte *)(*(long *)(in_RSI + 0xf0) + 0x53);
        local_248 = local_248 + 1) {
      in_stack_fffffffffffffda8 =
           (ulong)(*(byte *)(*(long *)(in_RSI + 0xf0) + 0x4b + (long)local_248) - 0x80);
      switch(in_stack_fffffffffffffda8) {
      case 0:
        local_244 = 1;
        break;
      case 1:
        local_244 = 2;
        break;
      case 2:
        local_244 = 3;
        break;
      case 3:
        local_244 = 4;
        break;
      case 4:
        local_244 = 5;
      }
      if (local_244 != 0) break;
    }
    *(int *)(lVar1 + 0x164) = local_244;
    SStream_Init((SStream *)local_224);
    if (*(int *)(lVar1 + 0x15c) == 0) {
      SStream_concat0((SStream *)
                      CONCAT44(in_stack_fffffffffffffda4,
                               CONCAT13(in_stack_fffffffffffffda3,
                                        CONCAT12(in_stack_fffffffffffffda2,in_stack_fffffffffffffda0
                                                ))),in_stack_fffffffffffffd98);
    }
    else {
      in_stack_fffffffffffffda4 = 0x7c;
      if (*(int *)(lVar1 + 0x160) == 1) {
        in_stack_fffffffffffffda4 = 0x21;
      }
      pcVar2 = cs_reg_name(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
      SStream_concat((SStream *)local_224,"[%c%s]|",(ulong)in_stack_fffffffffffffda4,pcVar2);
    }
    pcVar2 = strchr(in_RDX,9);
    local_230 = pcVar2;
    if (pcVar2 != (char *)0x0) {
      local_230 = pcVar2 + 1;
      *pcVar2 = '\0';
    }
    SStream_concat0((SStream *)
                    CONCAT44(in_stack_fffffffffffffda4,
                             CONCAT13(in_stack_fffffffffffffda3,
                                      CONCAT12(in_stack_fffffffffffffda2,in_stack_fffffffffffffda0))
                            ),in_stack_fffffffffffffd98);
    if ((local_230 == (char *)0x0) ||
       ((local_238 = strchr(local_230,0x5b), local_238 == (char *)0x0 &&
        (local_238 = strchr(local_230,0x28), local_238 == (char *)0x0)))) {
      local_240[0] = '\0';
    }
    else {
      while( true ) {
        in_stack_fffffffffffffda3 = false;
        if ((local_230 < local_238) &&
           (in_stack_fffffffffffffda2 = false, in_stack_fffffffffffffda3 = in_stack_fffffffffffffda2
           , *local_238 != 'a')) {
          in_stack_fffffffffffffda2 = *local_238 != 'b';
          in_stack_fffffffffffffda3 = in_stack_fffffffffffffda2;
        }
        if ((bool)in_stack_fffffffffffffda3 == false) break;
        local_238 = local_238 + -1;
      }
      if (local_238 == local_230) {
        strcpy(in_RDX,"Invalid!");
        return;
      }
      if (*local_238 == 'a') {
        strcpy(local_240,"1T");
      }
      else {
        strcpy(local_240,"2T");
      }
    }
    pcVar2 = (char *)(ulong)(*(int *)(lVar1 + 0x164) - 1);
    switch(pcVar2) {
    case (char *)0x0:
      SStream_concat((SStream *)local_224,".D%s%u",local_240,(ulong)*(uint *)(lVar1 + 0x168));
      break;
    case (char *)0x1:
      SStream_concat((SStream *)local_224,".L%s%u",local_240,(ulong)*(uint *)(lVar1 + 0x168));
      break;
    case (char *)0x2:
      SStream_concat((SStream *)local_224,".M%s%u",local_240,(ulong)*(uint *)(lVar1 + 0x168));
      break;
    case (char *)0x3:
      SStream_concat((SStream *)local_224,".S%s%u",local_240,(ulong)*(uint *)(lVar1 + 0x168));
    }
    if (*(int *)(lVar1 + 0x16c) != 0) {
      SStream_concat0((SStream *)
                      CONCAT44(in_stack_fffffffffffffda4,
                               CONCAT13(in_stack_fffffffffffffda3,
                                        CONCAT12(in_stack_fffffffffffffda2,in_stack_fffffffffffffda0
                                                ))),pcVar2);
    }
    if (local_230 != (char *)0x0) {
      SStream_concat((SStream *)local_224,"\t%s",local_230);
    }
    if (*(int *)(lVar1 + 0x170) != 0) {
      SStream_concat((SStream *)local_224,"\t||");
    }
    strcpy(in_RDX,local_224);
  }
  return;
}

Assistant:

void TMS320C64x_post_printer(csh ud, cs_insn *insn, char *insn_asm, MCInst *mci)
{
	SStream ss;
	char *p, *p2, tmp[8];
	unsigned int unit = 0;
	int i;
	cs_tms320c64x *tms320c64x;

	if (mci->csh->detail) {
		tms320c64x = &mci->flat_insn->detail->tms320c64x;

		for (i = 0; i < insn->detail->groups_count; i++) {
			switch(insn->detail->groups[i]) {
				case TMS320C64X_GRP_FUNIT_D:
					unit = TMS320C64X_FUNIT_D;
					break;
				case TMS320C64X_GRP_FUNIT_L:
					unit = TMS320C64X_FUNIT_L;
					break;
				case TMS320C64X_GRP_FUNIT_M:
					unit = TMS320C64X_FUNIT_M;
					break;
				case TMS320C64X_GRP_FUNIT_S:
					unit = TMS320C64X_FUNIT_S;
					break;
				case TMS320C64X_GRP_FUNIT_NO:
					unit = TMS320C64X_FUNIT_NO;
					break;
			}
			if (unit != 0)
				break;
		}
		tms320c64x->funit.unit = unit;

		SStream_Init(&ss);
		if (tms320c64x->condition.reg != TMS320C64X_REG_INVALID)
			SStream_concat(&ss, "[%c%s]|", (tms320c64x->condition.zero == 1) ? '!' : '|', cs_reg_name(ud, tms320c64x->condition.reg));
		else
			SStream_concat0(&ss, "||||||");

		p = strchr(insn_asm, '\t');
		if (p != NULL)
			*p++ = '\0';

		SStream_concat0(&ss, insn_asm);
		if ((p != NULL) && (((p2 = strchr(p, '[')) != NULL) || ((p2 = strchr(p, '(')) != NULL))) {
			while ((p2 > p) && ((*p2 != 'a') && (*p2 != 'b')))
				p2--;
			if (p2 == p) {
				strcpy(insn_asm, "Invalid!");
				return;
			}
			if (*p2 == 'a')
				strcpy(tmp, "1T");
			else
				strcpy(tmp, "2T");
		} else {
			tmp[0] = '\0';
		}
		switch(tms320c64x->funit.unit) {
			case TMS320C64X_FUNIT_D:
				SStream_concat(&ss, ".D%s%u", tmp, tms320c64x->funit.side);
				break;
			case TMS320C64X_FUNIT_L:
				SStream_concat(&ss, ".L%s%u", tmp, tms320c64x->funit.side);
				break;
			case TMS320C64X_FUNIT_M:
				SStream_concat(&ss, ".M%s%u", tmp, tms320c64x->funit.side);
				break;
			case TMS320C64X_FUNIT_S:
				SStream_concat(&ss, ".S%s%u", tmp, tms320c64x->funit.side);
				break;
		}
		if (tms320c64x->funit.crosspath > 0)
			SStream_concat0(&ss, "X");

		if (p != NULL)
			SStream_concat(&ss, "\t%s", p);

		if (tms320c64x->parallel != 0)
			SStream_concat(&ss, "\t||");

		/* insn_asm is a buffer from an SStream, so there should be enough space */
		strcpy(insn_asm, ss.buffer);
	}
}